

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

void SQCollectable::RemoveFromChain(SQCollectable_conflict **chain,SQCollectable_conflict *c)

{
  SQCollectable_conflict **ppSVar1;
  
  ppSVar1 = &c->_gc_prev->_gc_next;
  if (c->_gc_prev == (SQCollectable_conflict *)0x0) {
    ppSVar1 = chain;
  }
  *ppSVar1 = c->_gc_next;
  if (c->_gc_next != (SQCollectable_conflict *)0x0) {
    c->_gc_next->_gc_prev = c->_gc_prev;
  }
  c->_gc_next = (SQCollectable_conflict *)0x0;
  c->_gc_prev = (SQCollectable_conflict *)0x0;
  return;
}

Assistant:

void SQCollectable::RemoveFromChain(SQCollectable **chain,SQCollectable *c)
{
    if(c->_gc_prev) c->_gc_prev->_gc_next = c->_gc_next;
    else *chain = c->_gc_next;
    if(c->_gc_next)
        c->_gc_next->_gc_prev = c->_gc_prev;
    c->_gc_next = NULL;
    c->_gc_prev = NULL;
}